

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

u16string *
anon_unknown.dwarf_d849::codecvt_u32_to_u16(u16string *__return_storage_ptr__,u32string *u32)

{
  undefined1 local_38 [8];
  string u8;
  u32string *u32_local;
  
  u8.field_2._8_8_ = u32;
  codecvt_u32_to_u8((string *)local_38,u32);
  codecvt_u8_to_u16(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline
u16string codecvt_u32_to_u16(const u32string& u32)
{
    // As above, to avoid reinterpret_cast<> and trying to pretend that
    // a UTF-16 string is really a UTF-16 byte string, we do this in two steps
    const string u8 = codecvt_u32_to_u8(u32);
    return codecvt_u8_to_u16(u8);
}